

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::DynamicMapField::SyncMapWithRepeatedFieldNoLock(DynamicMapField *this)

{
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this_00;
  bool value;
  string sVar1;
  int iVar2;
  CppType CVar3;
  uint32 value_00;
  int32 value_01;
  undefined4 uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FieldDescriptor *this_01;
  undefined4 extraout_var_01;
  FieldDescriptor *this_02;
  RepeatedPtrField<google::protobuf::Message> *pRVar6;
  LogMessage *other;
  uint64 value_02;
  int64 value_03;
  MapValueRef *pMVar7;
  long *plVar8;
  string *this_03;
  long lVar9;
  Rep *pRVar10;
  void **ppvVar11;
  void **ppvVar12;
  iterator iter;
  MapKey map_key;
  iterator iter_1;
  long *plVar5;
  
  iVar2 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x16])();
  plVar5 = (long *)CONCAT44(extraout_var,iVar2);
  iVar2 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x17])();
  std::__cxx11::string::string((string *)&iter,"key",(allocator *)&iter_1);
  this_01 = Descriptor::FindFieldByName
                      ((Descriptor *)CONCAT44(extraout_var_00,iVar2),(string *)&iter);
  std::__cxx11::string::~string((string *)&iter);
  iVar2 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x17])();
  std::__cxx11::string::string((string *)&iter,"value",(allocator *)&iter_1);
  this_02 = Descriptor::FindFieldByName
                      ((Descriptor *)CONCAT44(extraout_var_01,iVar2),(string *)&iter);
  this_00 = &this->map_;
  std::__cxx11::string::~string((string *)&iter.it_);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::begin(&iter,this_00);
  while (iter.it_.node_ != (Node *)0x0) {
    MapValueRef::DeleteData(&(((iter.it_.node_)->kv).v_)->second);
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
    iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
    ::operator++(&iter.it_);
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::clear(this_00);
  pRVar6 = (this->
           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
           super_MapFieldBase.repeated_field_;
  pRVar10 = (pRVar6->super_RepeatedPtrFieldBase).rep_;
  ppvVar12 = pRVar10->elements;
  if (pRVar10 == (Rep *)0x0) {
    ppvVar12 = (void **)0x0;
  }
  do {
    ppvVar11 = pRVar10->elements;
    if (pRVar10 == (Rep *)0x0) {
      ppvVar11 = (void **)0x0;
    }
    if (ppvVar12 == ppvVar11 + (pRVar6->super_RepeatedPtrFieldBase).current_size_) {
      return;
    }
    map_key.type_ = 0;
    CVar3 = FieldDescriptor::cpp_type(this_01);
    switch(CVar3) {
    case CPPTYPE_INT32:
      value_01 = (**(code **)(*plVar5 + 0x88))(plVar5,*ppvVar12,this_01);
      MapKey::SetInt32Value(&map_key,value_01);
      break;
    case CPPTYPE_INT64:
      value_03 = (**(code **)(*plVar5 + 0x90))(plVar5,*ppvVar12,this_01);
      MapKey::SetInt64Value(&map_key,value_03);
      break;
    case CPPTYPE_UINT32:
      value_00 = (**(code **)(*plVar5 + 0x98))(plVar5,*ppvVar12,this_01);
      MapKey::SetUInt32Value(&map_key,value_00);
      break;
    case CPPTYPE_UINT64:
      value_02 = (**(code **)(*plVar5 + 0xa0))(plVar5,*ppvVar12,this_01);
      MapKey::SetUInt64Value(&map_key,value_02);
      break;
    case CPPTYPE_DOUBLE:
    case CPPTYPE_FLOAT:
    case CPPTYPE_ENUM:
    case CPPTYPE_MESSAGE:
      LogMessage::LogMessage
                ((LogMessage *)&iter,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/map_field.cc"
                 ,0x16e);
      other = LogMessage::operator<<((LogMessage *)&iter,"Can\'t get here.");
      LogFinisher::operator=((LogFinisher *)&iter_1,other);
      LogMessage::~LogMessage((LogMessage *)&iter);
      break;
    case CPPTYPE_BOOL:
      value = (bool)(**(code **)(*plVar5 + 0xb8))(plVar5,*ppvVar12,this_01);
      MapKey::SetBoolValue(&map_key,value);
      break;
    case CPPTYPE_STRING:
      (**(code **)(*plVar5 + 0xc0))((string *)&iter,plVar5,*ppvVar12,this_01);
      MapKey::SetStringValue(&map_key,(string *)&iter);
      std::__cxx11::string::~string((string *)&iter);
    }
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::find(&iter_1,this_00,&map_key);
    if (iter_1.it_.node_ != (Node *)0x0) {
      MapValueRef::DeleteData(&(((iter_1.it_.node_)->kv).v_)->second);
    }
    pMVar7 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::operator[]
                       (this_00,&map_key);
    CVar3 = FieldDescriptor::cpp_type(this_02);
    pMVar7->type_ = CVar3;
    CVar3 = FieldDescriptor::cpp_type(this_02);
    switch(CVar3) {
    case CPPTYPE_INT32:
      this_03 = (string *)operator_new(4);
      uVar4 = (**(code **)(*plVar5 + 0x88))(plVar5,*ppvVar12,this_02);
      goto LAB_005fa5bc;
    case CPPTYPE_INT64:
      this_03 = (string *)operator_new(8);
      lVar9 = (**(code **)(*plVar5 + 0x90))(plVar5,*ppvVar12,this_02);
      goto LAB_005fa5e2;
    case CPPTYPE_UINT32:
      this_03 = (string *)operator_new(4);
      uVar4 = (**(code **)(*plVar5 + 0x98))(plVar5,*ppvVar12,this_02);
      goto LAB_005fa5bc;
    case CPPTYPE_UINT64:
      this_03 = (string *)operator_new(8);
      lVar9 = (**(code **)(*plVar5 + 0xa0))(plVar5,*ppvVar12,this_02);
LAB_005fa5e2:
      *(long *)this_03 = lVar9;
      break;
    case CPPTYPE_DOUBLE:
      this_03 = (string *)operator_new(8);
      lVar9 = (**(code **)(*plVar5 + 0xb0))(plVar5,*ppvVar12,this_02);
      *(long *)this_03 = lVar9;
      break;
    case CPPTYPE_FLOAT:
      this_03 = (string *)operator_new(4);
      uVar4 = (**(code **)(*plVar5 + 0xa8))(plVar5,*ppvVar12,this_02);
      *(undefined4 *)this_03 = uVar4;
      break;
    case CPPTYPE_BOOL:
      this_03 = (string *)operator_new(1);
      sVar1 = (string)(**(code **)(*plVar5 + 0xb8))(plVar5,*ppvVar12,this_02);
      *this_03 = sVar1;
      break;
    case CPPTYPE_ENUM:
      this_03 = (string *)operator_new(4);
      uVar4 = (**(code **)(*plVar5 + 0xd0))(plVar5,*ppvVar12,this_02);
LAB_005fa5bc:
      *(undefined4 *)this_03 = uVar4;
      break;
    case CPPTYPE_STRING:
      this_03 = (string *)operator_new(0x20);
      *(string **)this_03 = this_03 + 0x10;
      *(undefined8 *)(this_03 + 8) = 0;
      this_03[0x10] = (string)0x0;
      (**(code **)(*plVar5 + 0xc0))((string *)&iter,plVar5,*ppvVar12,this_02);
      std::__cxx11::string::operator=(this_03,(string *)&iter);
      std::__cxx11::string::~string((string *)&iter);
      break;
    case CPPTYPE_MESSAGE:
      plVar8 = (long *)(**(code **)(*plVar5 + 0xd8))(plVar5,*ppvVar12,this_02,0);
      this_03 = (string *)(**(code **)(*plVar8 + 0x18))(plVar8);
      (**(code **)(*(long *)this_03 + 0x88))(this_03,plVar8);
      break;
    default:
      goto switchD_005fa4d9_default;
    }
    pMVar7->data_ = this_03;
switchD_005fa4d9_default:
    MapKey::~MapKey(&map_key);
    ppvVar12 = ppvVar12 + 1;
    pRVar6 = (this->
             super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
             .super_MapFieldBase.repeated_field_;
    pRVar10 = (pRVar6->super_RepeatedPtrFieldBase).rep_;
  } while( true );
}

Assistant:

void DynamicMapField::SyncMapWithRepeatedFieldNoLock() const {
  Map<MapKey, MapValueRef>* map = &const_cast<DynamicMapField*>(this)->map_;
  const Reflection* reflection = default_entry_->GetReflection();
  const FieldDescriptor* key_des =
      default_entry_->GetDescriptor()->FindFieldByName("key");
  const FieldDescriptor* val_des =
      default_entry_->GetDescriptor()->FindFieldByName("value");
  // DynamicMapField owns map values. Need to delete them before clearing
  // the map.
  for (Map<MapKey, MapValueRef>::iterator iter = map->begin();
       iter != map->end(); ++iter) {
    iter->second.DeleteData();
  }
  map->clear();
  for (RepeatedPtrField<Message>::iterator it =
           MapFieldBase::repeated_field_->begin();
       it != MapFieldBase::repeated_field_->end(); ++it) {
    MapKey map_key;
    switch (key_des->cpp_type()) {
      case google::protobuf::FieldDescriptor::CPPTYPE_STRING:
        map_key.SetStringValue(reflection->GetString(*it, key_des));
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_INT64:
        map_key.SetInt64Value(reflection->GetInt64(*it, key_des));
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_INT32:
        map_key.SetInt32Value(reflection->GetInt32(*it, key_des));
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_UINT64:
        map_key.SetUInt64Value(reflection->GetUInt64(*it, key_des));
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_UINT32:
        map_key.SetUInt32Value(reflection->GetUInt32(*it, key_des));
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_BOOL:
        map_key.SetBoolValue(reflection->GetBool(*it, key_des));
        break;
      case google::protobuf::FieldDescriptor::CPPTYPE_DOUBLE:
      case google::protobuf::FieldDescriptor::CPPTYPE_FLOAT:
      case google::protobuf::FieldDescriptor::CPPTYPE_ENUM:
      case google::protobuf::FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Can't get here.";
        break;
    }

    // Remove existing map value with same key.
    Map<MapKey, MapValueRef>::iterator iter = map->find(map_key);
    if (iter != map->end()) {
      iter->second.DeleteData();
    }

    MapValueRef& map_val = (*map)[map_key];
    map_val.SetType(val_des->cpp_type());
    switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE, METHOD)                      \
      case google::protobuf::FieldDescriptor::CPPTYPE_##CPPTYPE: {        \
        TYPE * value = new TYPE;                                \
        *value = reflection->Get##METHOD(*it, val_des);         \
            map_val.SetValue(value);                            \
            break;                                              \
      }
      HANDLE_TYPE(INT32, int32, Int32);
      HANDLE_TYPE(INT64, int64, Int64);
      HANDLE_TYPE(UINT32, uint32, UInt32);
      HANDLE_TYPE(UINT64, uint64, UInt64);
      HANDLE_TYPE(DOUBLE, double, Double);
      HANDLE_TYPE(FLOAT, float, Float);
      HANDLE_TYPE(BOOL, bool, Bool);
      HANDLE_TYPE(STRING, string, String);
      HANDLE_TYPE(ENUM, int32, EnumValue);
#undef HANDLE_TYPE
      case google::protobuf::FieldDescriptor::CPPTYPE_MESSAGE: {
        const Message& message = reflection->GetMessage(*it, val_des);
        Message* value = message.New();
        value->CopyFrom(message);
        map_val.SetValue(value);
        break;
      }
    }
  }
}